

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_graph.c
# Opt level: O3

ecs_table_t * find_or_create_table_exclude(ecs_world_t *world,ecs_table_t *node,ecs_entity_t remove)

{
  ecs_vector_t *vector;
  ecs_entity_t eVar1;
  long lVar2;
  ecs_table_t *peVar3;
  ecs_world_t *world_00;
  int32_t iVar4;
  uint uVar5;
  void *pvVar6;
  ecs_table_t *node_00;
  ecs_edge_t *peVar7;
  int iVar8;
  ulong uVar9;
  ecs_entity_t aeStack_70 [2];
  ecs_entities_t local_60;
  ecs_entity_t *local_50;
  ecs_table_t *local_48;
  ecs_world_t *local_40;
  ecs_entity_t local_38;
  
  vector = node->type;
  aeStack_70[0] = 0x1272e7;
  local_48 = node;
  local_40 = world;
  local_38 = remove;
  iVar4 = ecs_vector_count(vector);
  lVar2 = -((long)(iVar4 << 3) + 0xfU & 0xfffffffffffffff0);
  local_60.array = (ecs_entity_t *)((long)aeStack_70 + lVar2 + 8);
  local_50 = local_60.array;
  *(undefined8 *)((long)aeStack_70 + lVar2) = 0x12730d;
  uVar5 = ecs_vector_count(vector);
  *(undefined8 *)((long)aeStack_70 + lVar2) = 0x127322;
  pvVar6 = _ecs_vector_first(vector,8,0x10);
  if ((int)uVar5 < 1) {
    iVar8 = 0;
  }
  else {
    uVar9 = 0;
    iVar8 = 0;
    do {
      eVar1 = *(ecs_entity_t *)((long)pvVar6 + uVar9 * 8);
      if (eVar1 != local_38) {
        local_50[iVar8] = eVar1;
        *(undefined8 *)((long)aeStack_70 + lVar2) = 0x127372;
        _ecs_assert(iVar8 < (int)uVar5,0xc,(char *)0x0,"el <= count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                    ,0x15c);
        if ((int)uVar5 <= iVar8) {
          *(code **)((long)aeStack_70 + lVar2) = ecs_table_traverse_add;
          __assert_fail("el <= count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                        ,0x15c,
                        "void remove_entity_from_type(ecs_type_t, ecs_entity_t, ecs_entities_t *)");
        }
        iVar8 = iVar8 + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  world_00 = local_40;
  local_60.count = iVar8;
  *(undefined8 *)((long)aeStack_70 + lVar2) = 0x127398;
  node_00 = ecs_table_find_or_create(world_00,&local_60);
  eVar1 = local_38;
  peVar3 = local_48;
  if (node_00 != local_48 && node_00 != (ecs_table_t *)0x0) {
    *(undefined8 *)((long)aeStack_70 + lVar2) = 0x1273bb;
    peVar7 = get_edge(node_00,eVar1);
    if (peVar7->add == (ecs_table_t *)0x0) {
      peVar7->add = peVar3;
    }
  }
  return node_00;
}

Assistant:

static
ecs_table_t *find_or_create_table_exclude(
    ecs_world_t * world,
    ecs_table_t * node,
    ecs_entity_t remove)
{
    ecs_type_t type = node->type;
    int32_t count = ecs_vector_count(type);

    ecs_entities_t entities = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * count),
        .count = count
    };

    remove_entity_from_type(type, remove, &entities);

    ecs_table_t *result = ecs_table_find_or_create(world, &entities);
    if (!result) {
        return NULL;
    }

    if (result != node) {
        create_backlink_after_remove(result, node, remove);
    }

    return result;    
}